

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O0

Vec_Int_t * findHintOutputs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  char *pcVar2;
  Vec_Int_t *vHintPoIntdex;
  Abc_Obj_t *pNode;
  int numElementPush;
  int i;
  Abc_Ntk_t *pNtk_local;
  
  pNode._0_4_ = 0;
  pNtk_local = (Abc_Ntk_t *)Vec_IntAlloc(0);
  for (pNode._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), pNode._4_4_ < iVar1;
      pNode._4_4_ = pNode._4_4_ + 1) {
    pObj = Abc_NtkPo(pNtk,pNode._4_4_);
    pcVar2 = Abc_ObjName(pObj);
    pcVar2 = strstr(pcVar2,"hint_");
    if (pcVar2 != (char *)0x0) {
      Vec_IntPush((Vec_Int_t *)pNtk_local,pNode._4_4_);
      pNode._0_4_ = (int)pNode + 1;
    }
  }
  if ((int)pNode == 0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return (Vec_Int_t *)pNtk_local;
}

Assistant:

Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk)
{
	int i, numElementPush = 0;
	Abc_Obj_t *pNode;
	Vec_Int_t *vHintPoIntdex;

	vHintPoIntdex = Vec_IntAlloc(0);
	Abc_NtkForEachPo( pNtk, pNode, i )
	{
		if( strstr( Abc_ObjName( pNode ), "hint_" ) != NULL )
		{
			Vec_IntPush( vHintPoIntdex, i );
			numElementPush++;
		}
	}	
	
	if( numElementPush == 0 )
		return NULL;
	else
		return vHintPoIntdex;
}